

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O1

void capnp::_::expectPrimitiveEq<capnp::Data::Reader>(Reader a,Reader b)

{
  ulong uVar1;
  ulong in_RCX;
  ulong uVar2;
  char *in_RDX;
  ulong in_RSI;
  char *in_RDI;
  bool bVar3;
  Reader local_20;
  Reader local_10;
  
  if (in_RSI == in_RCX) {
    bVar3 = in_RSI == 0;
    if (!bVar3) {
      if (*in_RDI == *in_RDX) {
        uVar1 = 1;
        do {
          uVar2 = uVar1;
          if (in_RSI == uVar2) break;
          uVar1 = uVar2 + 1;
        } while (in_RDI[uVar2] == in_RDX[uVar2]);
        bVar3 = in_RSI <= uVar2;
      }
      else {
        bVar3 = false;
      }
    }
    if (bVar3) {
      return;
    }
  }
  if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[28],capnp::Data::Reader&,capnp::Data::Reader&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.h"
               ,0x9c,ERROR,"\"failed: expected \" \"(a) == (b)\", a, b",
               (char (*) [28])"failed: expected (a) == (b)",&local_10,&local_20);
  }
  return;
}

Assistant:

void expectPrimitiveEq(T a, T b) { EXPECT_EQ(a, b); }